

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O3

void __thiscall OpenMD::UniformGradient::modifyForces(UniformGradient *this)

{
  Mat3x3d *pMVar1;
  double dVar2;
  Atom *this_00;
  AtomType *pAVar3;
  DataStoragePointer DVar4;
  Snapshot *pSVar5;
  double dVar6;
  double dVar7;
  Molecule *pMVar8;
  bool bVar9;
  uint i_2;
  Molecule *pMVar10;
  Mat3x3d *pMVar11;
  uint i_1;
  long lVar12;
  double *pdVar13;
  uint j;
  long lVar14;
  Mat3x3d *pMVar15;
  double (*__return_storage_ptr__) [3];
  uint i_4;
  potVec *ppVar16;
  ulong uVar17;
  long lVar18;
  uint i_17;
  uint j_3;
  long lVar19;
  pointer ppAVar20;
  byte bVar21;
  double tmp;
  RealType RVar22;
  double dVar23;
  Vector<double,_3U> result_1;
  FluctuatingChargeAdapter fqa;
  Vector3d f;
  MoleculeIterator i;
  Vector3d r;
  Vector3d t;
  Vector3d D;
  Vector<double,_3U> result;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  Mat3x3d Q;
  double local_250;
  potVec local_248;
  undefined8 uStack_210;
  undefined8 local_208;
  FluctuatingChargeAdapter local_200;
  double local_1f8 [3];
  MoleculeIterator local_1e0;
  double local_1d8 [4];
  Vector3d local_1b8;
  double local_198 [4];
  double local_178 [4];
  double local_158 [10];
  RealType local_108;
  Molecule *local_100;
  MultipoleAdapter local_f8;
  FixedChargeAdapter local_f0;
  double local_e8 [10];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  potVec local_68;
  
  bVar21 = 0;
  if (this->initialized == false) {
    initialize(this);
  }
  local_1e0._M_node = (_Base_ptr)0x0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_178[2] = 0.0;
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  local_e8[8] = 0.0;
  local_e8[6] = 0.0;
  local_e8[7] = 0.0;
  local_e8[4] = 0.0;
  local_e8[5] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_198[2] = 0.0;
  local_198[0] = 0.0;
  local_198[1] = 0.0;
  local_1f8[2] = 0.0;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[1] = 0.0;
  if (this->doUniformGradient == true) {
    pMVar10 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_1e0);
    if (pMVar10 == (Molecule *)0x0) {
      local_250 = 0.0;
    }
    else {
      pMVar1 = &this->Grad_;
      local_250 = 0.0;
      do {
        ppAVar20 = (pMVar10->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pMVar8 = local_100;
        if (ppAVar20 !=
            (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_00 = *ppAVar20;
          while (local_100 = pMVar10, this_00 != (Atom *)0x0) {
            pAVar3 = this_00->atomType_;
            lVar14 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar12 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (this_00->super_StuntDouble).storage_);
            pdVar13 = (double *)(lVar12 + lVar14 * 0x18);
            local_1b8.super_Vector<double,_3U>.data_[0] = *pdVar13;
            local_1b8.super_Vector<double,_3U>.data_[1] = pdVar13[1];
            local_1b8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar12 + 0x10 + lVar14 * 0x18)
            ;
            Snapshot::wrapVector
                      (((this->super_ForceModifier).info_)->sman_->currentSnapshot_,&local_1b8);
            local_248.data_[0] = 0.0;
            local_248.data_[1] = 0.0;
            local_248.data_[2] = 0.0;
            lVar12 = 0;
            pMVar11 = pMVar1;
            do {
              dVar23 = local_248.data_[lVar12];
              lVar14 = 0;
              do {
                dVar23 = dVar23 + (pMVar11->super_SquareMatrix<double,_3>).
                                  super_RectMatrix<double,_3U,_3U>.data_[0][lVar14] *
                                  local_1b8.super_Vector<double,_3U>.data_[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_248.data_[lVar12] = dVar23;
              lVar12 = lVar12 + 1;
              pMVar11 = (Mat3x3d *)
                        ((pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 1);
            } while (lVar12 != 3);
            local_1d8[2] = local_248.data_[2];
            local_1d8[0] = local_248.data_[0];
            local_1d8[1] = local_248.data_[1];
            local_158[0] = 0.0;
            local_158[1] = 0.0;
            local_158[2] = 0.0;
            lVar12 = 0;
            do {
              local_158[lVar12] = local_1d8[lVar12] * 23.0609;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_248.data_[2] = local_158[2];
            local_248.data_[0] = local_158[0];
            local_248.data_[1] = local_158[1];
            lVar12 = (long)(this_00->super_StuntDouble).localIndex_ * 0x18 +
                     *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).electricField.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (this_00->super_StuntDouble).storage_);
            lVar14 = 0;
            do {
              *(double *)(lVar12 + lVar14 * 8) =
                   local_248.data_[lVar14] + *(double *)(lVar12 + lVar14 * 8);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            local_f0.at_ = pAVar3;
            bVar9 = FixedChargeAdapter::isFixedCharge(&local_f0);
            if (bVar9) {
              local_108 = FixedChargeAdapter::getCharge(&local_f0);
              local_200.at_ = pAVar3;
              bVar9 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_200);
              dVar23 = local_108;
              RVar22 = local_108;
              if (bVar9) {
LAB_0014f4fe:
                DVar4 = (this_00->super_StuntDouble).storage_;
                pSVar5 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
                lVar12 = (long)(this_00->super_StuntDouble).localIndex_;
                dVar23 = *(double *)
                          (*(long *)((long)&(pSVar5->atomData).flucQPos.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start + DVar4) +
                          lVar12 * 8);
                dVar6 = 0.0;
                lVar14 = 0;
                do {
                  dVar6 = dVar6 + local_1b8.super_Vector<double,_3U>.data_[lVar14] *
                                  local_1d8[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                lVar14 = *(long *)((long)&(pSVar5->atomData).flucQFrc.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar4);
                *(double *)(lVar14 + lVar12 * 8) =
                     dVar6 * 23.0609 + *(double *)(lVar14 + lVar12 * 8);
                dVar23 = RVar22 + dVar23;
              }
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_158[2] = 0.0;
              lVar12 = 0;
              do {
                local_158[lVar12] = local_1d8[lVar12] * dVar23;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              local_248.data_[0] = 0.0;
              local_248.data_[1] = 0.0;
              local_248.data_[2] = 0.0;
              lVar12 = 0;
              do {
                local_248.data_[lVar12] = local_158[lVar12] * 23.0609;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              local_1f8[2] = local_248.data_[2];
              local_1f8[0] = local_248.data_[0];
              local_1f8[1] = local_248.data_[1];
              DVar4 = (this_00->super_StuntDouble).storage_;
              pSVar5 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar12 = (long)(this_00->super_StuntDouble).localIndex_;
              lVar14 = lVar12 * 0x18 +
                       *(long *)((long)&(pSVar5->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + DVar4);
              lVar18 = 0;
              do {
                *(double *)(lVar14 + lVar18 * 8) =
                     local_1f8[lVar18] + *(double *)(lVar14 + lVar18 * 8);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              dVar23 = 0.0;
              lVar14 = 0;
              do {
                dVar23 = dVar23 + local_1b8.super_Vector<double,_3U>.data_[lVar14] *
                                  local_1f8[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              if (this->doParticlePot == true) {
                lVar14 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar4);
                *(double *)(lVar14 + lVar12 * 8) = *(double *)(lVar14 + lVar12 * 8) - dVar23;
              }
              local_250 = local_250 - dVar23;
            }
            else {
              local_200.at_ = pAVar3;
              bVar9 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_200);
              RVar22 = 0.0;
              if (bVar9) goto LAB_0014f4fe;
            }
            local_f8.at_ = pAVar3;
            bVar9 = MultipoleAdapter::isDipole(&local_f8);
            if (bVar9) {
              lVar14 = (long)(this_00->super_StuntDouble).localIndex_;
              lVar12 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).dipole.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (this_00->super_StuntDouble).storage_);
              local_158[2] = *(double *)(lVar12 + 0x10 + lVar14 * 0x18);
              pdVar13 = (double *)(lVar12 + lVar14 * 0x18);
              local_158[0] = *pdVar13;
              local_158[1] = pdVar13[1];
              local_248.data_[0] = 0.0;
              local_248.data_[1] = 0.0;
              local_248.data_[2] = 0.0;
              lVar12 = 0;
              do {
                local_248.data_[lVar12] = local_158[lVar12] * 4.8018969509;
                dVar7 = local_248.data_[2];
                dVar6 = local_248.data_[1];
                dVar23 = local_248.data_[0];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              local_178[2] = local_248.data_[2];
              local_178[0] = local_248.data_[0];
              local_178[1] = local_248.data_[1];
              local_248.data_[0] = 0.0;
              local_248.data_[1] = 0.0;
              local_248.data_[2] = 0.0;
              lVar12 = 0;
              pMVar11 = pMVar1;
              do {
                dVar2 = local_248.data_[lVar12];
                lVar14 = 0;
                pMVar15 = pMVar11;
                do {
                  dVar2 = dVar2 + local_178[lVar14] *
                                  (pMVar15->super_SquareMatrix<double,_3>).
                                  super_RectMatrix<double,_3U,_3U>.data_[0][0];
                  lVar14 = lVar14 + 1;
                  pMVar15 = (Mat3x3d *)
                            ((pMVar15->super_SquareMatrix<double,_3>).
                             super_RectMatrix<double,_3U,_3U>.data_ + 1);
                } while (lVar14 != 3);
                local_248.data_[lVar12] = dVar2;
                lVar12 = lVar12 + 1;
                pMVar11 = (Mat3x3d *)
                          ((pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
                           .data_[0] + 1);
              } while (lVar12 != 3);
              local_1f8[2] = local_248.data_[2];
              local_1f8[0] = local_248.data_[0];
              local_1f8[1] = local_248.data_[1];
              lVar12 = (long)(this_00->super_StuntDouble).localIndex_ * 0x18 +
                       *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (this_00->super_StuntDouble).storage_);
              lVar14 = 0;
              do {
                *(double *)(lVar12 + lVar14 * 8) =
                     local_1f8[lVar14] + *(double *)(lVar12 + lVar14 * 8);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_198[0] = local_1d8[2] * dVar6 - dVar7 * local_1d8[1];
              local_198[1] = local_1d8[0] * dVar7 - dVar23 * local_1d8[2];
              local_198[2] = dVar23 * local_1d8[1] - local_1d8[0] * dVar6;
              DVar4 = (this_00->super_StuntDouble).storage_;
              pSVar5 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar12 = (long)(this_00->super_StuntDouble).localIndex_;
              lVar14 = lVar12 * 0x18 +
                       *(long *)((long)&(pSVar5->atomData).torque.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + DVar4);
              lVar18 = 0;
              do {
                *(double *)(lVar14 + lVar18 * 8) =
                     local_198[lVar18] + *(double *)(lVar14 + lVar18 * 8);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              dVar23 = 0.0;
              lVar14 = 0;
              do {
                dVar23 = dVar23 + local_178[lVar14] * local_1d8[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              if (this->doParticlePot == true) {
                lVar14 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar4);
                *(double *)(lVar14 + lVar12 * 8) = *(double *)(lVar14 + lVar12 * 8) - dVar23;
              }
              local_250 = local_250 - dVar23;
            }
            bVar9 = MultipoleAdapter::isQuadrupole(&local_f8);
            if (bVar9) {
              __return_storage_ptr__ = (double (*) [3])local_158;
              StuntDouble::getQuadrupole
                        ((Mat3x3d *)__return_storage_ptr__,&this_00->super_StuntDouble);
              local_248.data_[6] = 0.0;
              uStack_210 = 0;
              local_248.data_[4] = 0.0;
              local_248.data_[5] = 0.0;
              local_248.data_[2] = 0.0;
              local_248.data_[3] = 0.0;
              local_248.data_[0] = 0.0;
              local_248.data_[1] = 0.0;
              local_208 = 0;
              pdVar13 = local_248.data_;
              lVar12 = 0;
              do {
                lVar14 = 0;
                do {
                  pdVar13[lVar14] =
                       (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                       super_RectMatrix<double,_3U,_3U>).data_[0][lVar14] * 4.8018969509;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                lVar12 = lVar12 + 1;
                pdVar13 = pdVar13 + 3;
                __return_storage_ptr__ = __return_storage_ptr__ + 1;
              } while (lVar12 != 3);
              ppVar16 = &local_248;
              pdVar13 = local_e8;
              for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
                *pdVar13 = ppVar16->data_[0];
                ppVar16 = (potVec *)((long)ppVar16 + ((ulong)bVar21 * -2 + 1) * 8);
                pdVar13 = pdVar13 + (ulong)bVar21 * -2 + 1;
              }
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_158[2] = 0.0;
              lVar12 = 0;
              do {
                lVar18 = lVar12 + 1;
                uVar17 = (ulong)((int)lVar12 - 1);
                lVar14 = lVar18;
                if (lVar18 == 3) {
                  lVar14 = 0;
                }
                if (lVar12 == 0) {
                  uVar17 = 2;
                }
                dVar23 = local_158[lVar12];
                lVar19 = 0;
                do {
                  dVar23 = dVar23 + (*(double *)((long)local_e8 + lVar19 + lVar14 * 0x18) *
                                     *(double *)
                                      ((long)(pMVar1->super_SquareMatrix<double,_3>).
                                             super_RectMatrix<double,_3U,_3U>.data_[uVar17] + lVar19
                                      ) - *(double *)
                                           ((long)(pMVar1->super_SquareMatrix<double,_3>).
                                                  super_RectMatrix<double,_3U,_3U>.data_[lVar14] +
                                           lVar19) *
                                          *(double *)((long)local_e8 + lVar19 + uVar17 * 0x18));
                  lVar19 = lVar19 + 8;
                } while (lVar19 != 0x18);
                local_158[lVar12] = dVar23;
                lVar12 = lVar18;
              } while (lVar18 != 3);
              local_248.data_[0] = 0.0;
              local_248.data_[1] = 0.0;
              local_248.data_[2] = 0.0;
              lVar12 = 0;
              do {
                local_248.data_[lVar12] = local_158[lVar12] + local_158[lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              local_198[2] = local_248.data_[2];
              local_198[0] = local_248.data_[0];
              local_198[1] = local_248.data_[1];
              DVar4 = (this_00->super_StuntDouble).storage_;
              pSVar5 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar12 = (long)(this_00->super_StuntDouble).localIndex_;
              lVar14 = lVar12 * 0x18 +
                       *(long *)((long)&(pSVar5->atomData).torque.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + DVar4);
              lVar18 = 0;
              do {
                *(double *)(lVar14 + lVar18 * 8) =
                     local_198[lVar18] + *(double *)(lVar14 + lVar18 * 8);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              dVar23 = 0.0;
              pdVar13 = local_e8;
              lVar14 = 0;
              pMVar11 = pMVar1;
              do {
                lVar18 = 0;
                do {
                  dVar23 = dVar23 + pdVar13[lVar18] *
                                    (pMVar11->super_SquareMatrix<double,_3>).
                                    super_RectMatrix<double,_3U,_3U>.data_[0][lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                lVar14 = lVar14 + 1;
                pMVar11 = (Mat3x3d *)
                          ((pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
                           .data_ + 1);
                pdVar13 = pdVar13 + 3;
              } while (lVar14 != 3);
              if (this->doParticlePot == true) {
                lVar14 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar4);
                *(double *)(lVar14 + lVar12 * 8) = *(double *)(lVar14 + lVar12 * 8) - dVar23;
              }
              local_250 = local_250 - dVar23;
            }
            ppAVar20 = ppAVar20 + 1;
            pMVar8 = local_100;
            if (ppAVar20 ==
                (local_100->atoms_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) break;
            pMVar10 = local_100;
            this_00 = *ppAVar20;
          }
        }
        local_100 = pMVar8;
        pMVar10 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_1e0);
      } while (pMVar10 != (Molecule *)0x0);
    }
    pSVar5 = ((this->super_ForceModifier).info_)->sman_->currentSnapshot_;
    Snapshot::getLongRangePotentials(&local_248,pSVar5);
    local_78 = local_248.data_[0];
    dStack_70 = local_248.data_[1];
    local_88 = local_248.data_[5];
    dStack_80 = local_248.data_[6];
    local_98 = local_248.data_[3];
    dStack_90 = local_248.data_[4];
    local_68.data_[2] = local_250 + local_248.data_[2];
    local_68.data_[0] = local_248.data_[0];
    local_68.data_[1] = local_248.data_[1];
    local_68.data_[3] = local_248.data_[3];
    local_68.data_[4] = local_248.data_[4];
    local_68.data_[5] = local_248.data_[5];
    local_68.data_[6] = local_248.data_[6];
    Snapshot::setLongRangePotentials(pSVar5,&local_68);
  }
  return;
}

Assistant:

void UniformGradient::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);

    RealType C;
    Vector3d D;
    Mat3x3d Q;

    RealType U;
    RealType fPot;
    Vector3d t;
    Vector3d f;

    Vector3d r;
    Vector3d EF;

    bool isCharge;

    if (doUniformGradient) {
      U    = 0.0;
      fPot = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          EF = Grad_ * r;

          atom->addElectricField(EF * Constants::chargeFieldConvert);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF) * Constants::chargeFieldConvert);
          }

          if (isCharge) {
            f = EF * C * Constants::chargeFieldConvert;
            atom->addFrc(f);

            U = -dot(r, f);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            f = D * Grad_;
            atom->addFrc(f);

            t = cross(D, EF);
            atom->addTrq(t);

            U = -dot(D, EF);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          if (ma.isQuadrupole()) {
            Q = atom->getQuadrupole() * Constants::dipoleFieldConvert;

            t = 2.0 * mCross(Q, Grad_);
            atom->addTrq(t);

            U = -doubleDot(Q, Grad_);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }